

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void wallwalk_right(level *lev,xchar x,xchar y,schar fgtyp,schar fglit,schar bgtyp,int chance)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  trap *ptVar8;
  bool local_52;
  int local_30;
  int iStack_2c;
  schar tmptyp;
  int cnt;
  int dir;
  int ny;
  int nx;
  int sy;
  int sx;
  schar bgtyp_local;
  schar fglit_local;
  schar fgtyp_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  iStack_2c = 1;
  if (((('\0' < x) && (x < 'P')) && (-1 < y)) &&
     ((y < '\x15' && (sx._2_1_ = y, sx._3_1_ = x, lev->locations[x][y].typ == bgtyp)))) {
    do {
      ptVar8 = t_at(lev,(int)sx._3_1_,(int)sx._2_1_);
      if (((ptVar8 == (trap *)0x0) &&
          ((bVar5 = bydoor(lev,sx._3_1_,sx._2_1_), bVar5 == '\0' &&
           (lev->locations[sx._3_1_][sx._2_1_].typ == bgtyp)))) &&
         (iVar6 = rn2(100), iVar6 <= chance)) {
        if (fgtyp < '\'') {
          lev->locations[sx._3_1_][sx._2_1_].typ = fgtyp;
        }
        if (fgtyp == '\x15') {
          *(uint *)&lev->locations[sx._3_1_][sx._2_1_].field_0x6 =
               *(uint *)&lev->locations[sx._3_1_][sx._2_1_].field_0x6 & 0xfffffbff | 0x400;
        }
        else if (fglit != -2) {
          if (fglit == -1) {
            uVar7 = rn2(2);
            *(uint *)&lev->locations[sx._3_1_][sx._2_1_].field_0x6 =
                 *(uint *)&lev->locations[sx._3_1_][sx._2_1_].field_0x6 & 0xfffffbff |
                 (uVar7 & 1) << 10;
          }
          else {
            *(uint *)&lev->locations[sx._3_1_][sx._2_1_].field_0x6 =
                 *(uint *)&lev->locations[sx._3_1_][sx._2_1_].field_0x6 & 0xfffffbff |
                 ((int)fglit & 1U) << 10;
          }
        }
      }
      local_30 = 0;
      do {
        cVar4 = sx._3_1_;
        cVar3 = sx._2_1_;
        switch(iStack_2c % 4) {
        case 0:
          sx._2_1_ = sx._2_1_ + -1;
          break;
        case 1:
          sx._3_1_ = sx._3_1_ + '\x01';
          break;
        case 2:
          sx._2_1_ = sx._2_1_ + '\x01';
          break;
        case 3:
          sx._3_1_ = sx._3_1_ + -1;
        }
        if ((((sx._3_1_ < '\x01') || ('O' < sx._3_1_)) || (sx._2_1_ < '\0')) || ('\x14' < sx._2_1_))
        {
          iStack_2c = iStack_2c + 1;
          local_30 = local_30 + 1;
          sx._2_1_ = cVar3;
          sx._3_1_ = cVar4;
        }
        else {
          cVar1 = lev->locations[sx._3_1_][sx._2_1_].typ;
          if ((cVar1 == bgtyp) || (cVar1 == fgtyp)) {
            iStack_2c = (iStack_2c + 3) % 4;
          }
          else {
            iStack_2c = iStack_2c + 1;
            local_30 = local_30 + 1;
            sx._2_1_ = cVar3;
            sx._3_1_ = cVar4;
          }
        }
        bVar2 = false;
        if ((cVar4 == sx._3_1_) && (bVar2 = false, cVar3 == sx._2_1_)) {
          bVar2 = local_30 < 5;
        }
      } while (bVar2);
      local_52 = sx._3_1_ != x || sx._2_1_ != y;
    } while (local_52);
  }
  return;
}

Assistant:

void wallwalk_right(struct level *lev, xchar x, xchar y,
		    schar fgtyp, schar fglit, schar bgtyp, int chance)
{
	int sx, sy, nx, ny, dir, cnt;
	schar tmptyp;
	sx = x;
	sy = y;
	dir = 1;

	if (!isok(x,y)) return;
	if (lev->locations[x][y].typ != bgtyp) return;

	do {
	    if (!t_at(lev, x, y) && !bydoor(lev, x, y) &&
		lev->locations[x][y].typ == bgtyp && chance >= rn2(100)) {
		SET_TYPLIT(lev, x, y, fgtyp, fglit);
	    }
	    cnt = 0;
	    do {
		nx = x;
		ny = y;
		switch (dir % 4) {
		case 0: y--; break;
		case 1: x++; break;
		case 2: y++; break;
		case 3: x--; break;
		}
		if (isok(x, y)) {
		    tmptyp = lev->locations[x][y].typ;
		    if (tmptyp != bgtyp && tmptyp != fgtyp) {
			dir++;
			x = nx;
			y = ny;
			cnt++;
		    } else {
			dir = (dir + 3) % 4;
		    }
		} else {
		    dir++;
		    x = nx;
		    y = ny;
		    cnt++;
		}
	    } while (nx == x && ny == y && cnt < 5);
	} while (x != sx || y != sy);
}